

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  undefined8 in_RAX;
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  iterator iVar6;
  undefined8 local_18;
  
  piVar1 = (int *)&local_18;
  local_18 = in_RAX;
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    iVar6._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar6._M_current == piVar2) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar6,
                 &FileDescriptorProto::kEnumTypeFieldNumber);
      lVar4 = *(long *)(this + 0x18);
      iVar6._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar2 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar6._M_current = 5;
      iVar6._M_current = iVar6._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar6._M_current;
      lVar4 = 0;
    }
    plVar5 = (long *)(*(long *)(this + 0x10) + 0x70);
    if (lVar4 != 0) {
      plVar5 = (long *)(lVar4 + 0x60);
    }
    iVar3 = (int)((ulong)((long)this - *plVar5) >> 3) * -0x49249249;
    local_18 = CONCAT44(local_18._4_4_,iVar3);
    if (iVar6._M_current != piVar2) goto LAB_0056fe1b;
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
    iVar6._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar6._M_current == piVar1) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar6,
                 &DescriptorProto::kEnumTypeFieldNumber);
      iVar6._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar6._M_current = 4;
      iVar6._M_current = iVar6._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar6._M_current;
    }
    plVar5 = (long *)(*(long *)(this + 0x10) + 0x70);
    if (*(long *)(this + 0x18) != 0) {
      plVar5 = (long *)(*(long *)(this + 0x18) + 0x60);
    }
    iVar3 = (int)((ulong)((long)this - *plVar5) >> 3) * -0x49249249;
    local_18 = CONCAT44(iVar3,(int)local_18);
    if (iVar6._M_current != piVar1) {
LAB_0056fe1b:
      *iVar6._M_current = iVar3;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar6._M_current + 1;
      return;
    }
    piVar1 = (int *)((long)&local_18 + 4);
  }
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar6,piVar1);
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}